

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManEquivCountLitsAll(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)p->nObjs) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = (iVar1 + 1) - (uint)((~(uint)p->pReprs[lVar2] & 0xfffffff) == 0);
      lVar2 = lVar2 + 1;
    } while (p->nObjs != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Gia_ManEquivCountLitsAll( Gia_Man_t * p )
{
    int i, nLits = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        nLits += (Gia_ObjRepr(p, i) != GIA_VOID);
    return nLits;
}